

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase694::run(TestCase694 *this)

{
  word *pwVar1;
  size_t sVar2;
  PointerBuilder builder_00;
  word *pwVar3;
  word *pwVar4;
  bool bVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  ArrayPtr<const_unsigned_int> value;
  Reader value_00;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  bool local_1b8;
  PointerBuilder local_1a8;
  Builder root;
  char *local_160;
  Builder local_158;
  OrphanBuilder local_140;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1a8,&builder.super_MessageBuilder);
  _kjCondition.op.content.ptr = (char *)local_1a8.pointer;
  _kjCondition._0_8_ = local_1a8.segment;
  _kjCondition.right = (unsigned_long)local_1a8.capTable;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x140006);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  pwVar3 = (AVar6.ptr)->ptr;
  sVar2 = (AVar6.ptr)->size_;
  local_1a8.segment = (SegmentBuilder *)0x220000000c;
  local_1a8.capTable = (CapTableBuilder *)CONCAT44(local_1a8.capTable._4_4_,0x38);
  _kjCondition.op.content.ptr = (char *)(root._builder.pointers + 0xb);
  _kjCondition._0_8_ = root._builder.segment;
  _kjCondition.right = (unsigned_long)root._builder.capTable;
  builder_00.capTable = root._builder.capTable;
  builder_00.segment = root._builder.segment;
  builder_00.pointer = (WirePointer *)_kjCondition.op.content.ptr;
  value.size_ = 3;
  value.ptr = (uint *)&local_1a8;
  PointerHelpers<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  pwVar4 = (AVar6.ptr)->ptr + (AVar6.ptr)->size_;
  _kjCondition._0_8_ = root._builder.segment;
  _kjCondition.right = (unsigned_long)root._builder.capTable;
  _kjCondition.op.content.ptr = (char *)root._builder.pointers;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&_kjCondition,value_00);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  _kjCondition.right = AVar6.size_;
  _kjCondition.left = 1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 1;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_158._0_4_ = 1;
    AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    local_1a8.segment = (SegmentBuilder *)AVar6.size_;
    kj::_::Debug::
    log<char_const(&)[65],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2c0,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", _kjCondition, 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               &_kjCondition,(uint *)&local_158,(unsigned_long *)&local_1a8);
  }
  local_1a8.pointer = root._builder.pointers + 0xb;
  local_1a8.segment = root._builder.segment;
  local_1a8.capTable = root._builder.capTable;
  PointerBuilder::disown((OrphanBuilder *)&_kjCondition,&local_1a8);
  local_140.segment = (SegmentBuilder *)_kjCondition.right;
  local_140.capTable = (CapTableBuilder *)_kjCondition.op.content.ptr;
  local_140.location = (word *)_kjCondition.op.content.size_;
  local_140.tag.content = _kjCondition._0_8_;
  if (_kjCondition.right != 0) {
    OrphanBuilder::euthanize(&local_140);
  }
  pwVar1 = pwVar3 + sVar2;
  if (pwVar1 < pwVar4) {
    if ((char)pwVar1->content == '\0') {
      pwVar3 = pwVar3 + sVar2;
      do {
        pwVar3 = (word *)((long)&pwVar3->content + 1);
        if (pwVar3 == pwVar4) break;
      } while ((char)pwVar3->content == '\0');
      bVar5 = pwVar4 <= pwVar3;
    }
    else {
      bVar5 = false;
    }
    _kjCondition.left._0_1_ = bVar5;
    if ((bVar5 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[47],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2c4,ERROR,
                 "\"failed: expected \" \"allZero(zerosStart, zerosEnd)\", _kjCondition",
                 (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)",
                 (DebugExpression<bool> *)&_kjCondition);
    }
  }
  local_160 = "foo";
  local_1a8.segment = root._builder.segment;
  local_1a8.capTable = root._builder.capTable;
  local_1a8.pointer = root._builder.pointers;
  PointerBuilder::getBlob<capnp::Text>(&local_158,&local_1a8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&local_160,&local_158);
  if ((local_1b8 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1a8.segment = root._builder.segment;
    local_1a8.capTable = root._builder.capTable;
    local_1a8.pointer = root._builder.pointers;
    PointerBuilder::getBlob<capnp::Text>(&local_158,&local_1a8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2c6,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", _kjCondition, \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [4])"foo",&local_158);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, ListsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setUInt32List({12, 34, 56});
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownUInt32List();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}